

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImVec2 p_min;
  bool bVar1;
  byte bVar2;
  ImU32 IVar3;
  ImU32 fill_col;
  ImGuiWindow *pIVar4;
  uint in_EDX;
  undefined4 in_ESI;
  float fVar5;
  undefined8 in_XMM0_Qa;
  ImVec2 IVar6;
  float in_stack_0000003c;
  ImGuiDir in_stack_00000040;
  ImU32 in_stack_00000044;
  ImDrawList *in_stack_00000048;
  ImVec2 in_stack_00000050;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  float default_size;
  ImRect bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff50;
  float fVar7;
  ImGuiCol in_stack_ffffffffffffff54;
  ImRect *in_stack_ffffffffffffff58;
  ImGuiWindow *in_stack_ffffffffffffff60;
  ImRect *in_stack_ffffffffffffff68;
  ImVec2 local_80;
  ImVec2 local_78;
  undefined1 in_stack_ffffffffffffffa3;
  ImGuiButtonFlags in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImGuiContext *pIVar8;
  float local_c;
  float fStack_8;
  bool local_1;
  
  pIVar8 = GImGui;
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) == 0) {
    ImGuiWindow::GetID(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                       (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    IVar6 = ::operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x4e6a14);
    fVar7 = IVar6.x;
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffbc,&(pIVar4->DC).CursorPos,
                   (ImVec2 *)&stack0xffffffffffffffb4);
    fVar5 = GetFrameHeight();
    fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
    ItemSize((ImVec2 *)in_stack_ffffffffffffff60,(float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    bVar1 = ItemAdd(in_stack_ffffffffffffff68,(ImGuiID)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                    in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    if (bVar1) {
      if (((pIVar8->LastItemData).InFlags & 2U) != 0) {
        in_EDX = in_EDX | 0x400;
      }
      bVar2 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                             ,(ImGuiID)in_stack_ffffffffffffffbc,(bool *)CONCAT44(fVar7,fVar5),
                             (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                              CONCAT16(in_stack_ffffffffffffffae,
                                                       CONCAT15(in_stack_ffffffffffffffad,
                                                                CONCAT14(in_stack_ffffffffffffffac,
                                                                         in_stack_ffffffffffffffa8))
                                                      )),in_stack_ffffffffffffffa4);
      IVar3 = GetColorU32(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      fill_col = GetColorU32(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      RenderNavHighlight((ImRect *)CONCAT44(in_ESI,in_EDX),(ImGuiID)((ulong)pIVar8 >> 0x20),
                         (ImGuiNavHighlightFlags)pIVar8);
      p_min.y = fVar7;
      p_min.x = fVar5;
      IVar6.y._0_1_ = in_stack_ffffffffffffffac;
      IVar6.x = (float)IVar3;
      IVar6.y._1_1_ = bVar2;
      IVar6.y._2_1_ = in_stack_ffffffffffffffae;
      IVar6.y._3_1_ = in_stack_ffffffffffffffaf;
      RenderFrame(p_min,IVar6,fill_col,(bool)in_stack_ffffffffffffffa3,in_stack_ffffffffffffffc0);
      local_c = (float)in_XMM0_Qa;
      fVar7 = 0.0;
      fVar5 = ImMax<float>(0.0,(local_c - pIVar8->FontSize) * 0.5);
      fVar7 = ImMax<float>(fVar7,(fStack_8 - pIVar8->FontSize) * 0.5);
      ImVec2::ImVec2(&local_80,fVar5,fVar7);
      local_78 = ::operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x4e6c7c);
      RenderArrow(in_stack_00000048,in_stack_00000050,in_stack_00000044,in_stack_00000040,
                  in_stack_0000003c);
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (g.LastItemData.InFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, str_id, g.LastItemData.StatusFlags);
    return pressed;
}